

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O3

UINT8 device_start_multipcm(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint *puVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  UINT8 UVar6;
  int iVar7;
  DEV_DATA DVar8;
  uint uVar9;
  INT32 *pIVar10;
  INT32 (*paIVar11) [256];
  long lVar12;
  MultiPCM *ptChip;
  int iVar13;
  int iVar14;
  ulong uVar15;
  INT32 (*paIVar16) [256];
  long lVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  float fVar33;
  float fVar34;
  
  DVar8.chipInf = calloc(1,0x2658);
  if ((DEV_DATA *)DVar8.chipInf == (DEV_DATA *)0x0) {
    UVar6 = 0xff;
  }
  else {
    fVar19 = (float)cfg->clock / 224.0;
    *(float *)((long)DVar8.chipInf + 0x143c) = fVar19;
    if (IsInit == '\0') {
      IsInit = '\x01';
      lVar18 = 0;
      lVar12 = 0;
      do {
        fVar20 = powf(10.0,((float)(int)lVar12 * -24.0 * 0.015625) / 20.0);
        uVar9 = 0x10;
        uVar15 = 0;
        lVar17 = lVar18;
        do {
          iVar7 = (int)uVar15;
          if (iVar7 == 8) {
            fVar21 = 0.0;
            fVar33 = 0.0;
          }
          else if (iVar7 == 0) {
            fVar33 = 1.0;
            fVar21 = 1.0;
          }
          else if (uVar15 < 8) {
            fVar21 = powf(10.0,((float)iVar7 * -12.0 * 0.25) / 20.0);
            fVar33 = 0.0;
            if (uVar15 != 7) {
              fVar33 = fVar21;
            }
            fVar21 = 1.0;
          }
          else {
            fVar33 = powf(10.0,((float)(int)uVar9 * -12.0 * 0.25) / 20.0);
            fVar21 = 0.0;
            if ((~uVar9 & 7) != 0) {
              fVar21 = fVar33;
            }
            fVar33 = 1.0;
          }
          *(int *)((long)left_pan_table + lVar17) = (int)(long)(fVar33 * fVar20 * 0.25 * 4096.0);
          *(int *)((long)right_pan_table + lVar17) = (int)(long)(fVar21 * fVar20 * 0.25 * 4096.0);
          uVar15 = uVar15 + 1;
          uVar9 = uVar9 - 1;
          lVar17 = lVar17 + 0x200;
        } while (uVar15 != 0x10);
        lVar12 = lVar12 + 1;
        lVar18 = lVar18 + 4;
      } while (lVar12 != 0x80);
      pIVar10 = linear_to_exp_volume;
      lVar12 = 0;
      do {
        fVar20 = powf(10.0,((float)(int)lVar12 * 96.0 * -0.0009765625 + 96.0) / -20.0);
        *pIVar10 = (INT32)(long)(fVar20 * 4096.0);
        lVar12 = lVar12 + 1;
        pIVar10 = pIVar10 + 1;
      } while (lVar12 != 0x400);
      iVar7 = 0xff;
      lVar12 = -0x200;
      lVar18 = 0;
      uVar15 = 0;
      do {
        iVar13 = (int)lVar12;
        if (uVar15 < 0x40) {
          iVar13 = iVar13 + 0x280;
LAB_00164afc:
          *(int *)((long)pitch_table + lVar18) = iVar13;
          *(int *)((long)amplitude_table + lVar18) = iVar7;
        }
        else {
          if (uVar15 < 0x80) {
            iVar13 = iVar7 + 0x80;
            goto LAB_00164afc;
          }
          iVar14 = iVar13;
          if (uVar15 < 0xc0) {
            iVar14 = iVar7;
          }
          *(int *)((long)pitch_table + lVar18) = iVar14 + 0x81;
          *(int *)((long)amplitude_table + lVar18) = iVar13 + 0x100;
        }
        uVar15 = uVar15 + 1;
        iVar7 = iVar7 + -2;
        lVar18 = lVar18 + 4;
        lVar12 = lVar12 + 2;
      } while (lVar12 != 0);
      paIVar11 = pitch_scale_tables;
      paIVar16 = amplitude_scale_tables;
      lVar12 = 0;
      do {
        fVar20 = PHASE_SCALE_LIMIT[lVar12];
        lVar18 = 0;
        do {
          fVar21 = exp2f(((float)((int)lVar18 + -0x80) * fVar20 * 0.0078125) / 1200.0);
          (*paIVar11)[lVar18] = (INT32)(long)(fVar21 * 256.0);
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x100);
        fVar20 = AMPLITUDE_SCALE_LIMIT[lVar12];
        lVar18 = 0;
        do {
          fVar21 = powf(10.0,((float)(int)lVar18 * -fVar20 * 0.00390625) / 20.0);
          (*paIVar16)[lVar18] = (INT32)(long)(fVar21 * 256.0);
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x100);
        lVar12 = lVar12 + 1;
        paIVar11 = paIVar11 + 1;
        paIVar16 = paIVar16 + 1;
      } while (lVar12 != 8);
    }
    uVar9 = 0;
    uVar22 = 1;
    uVar23 = 2;
    uVar24 = 3;
    lVar12 = 0x590;
    do {
      fVar20 = (((float)(uVar9 >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(uVar9 & 0xffff | 0x4b000000) + 1024.0) * fVar19 * 0.0009765625 * 4096.0;
      fVar21 = (((float)(uVar22 >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(uVar22 & 0xffff | 0x4b000000) + 1024.0) * fVar19 * 0.0009765625 * 4096.0;
      fVar33 = (((float)(uVar23 >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(uVar23 & 0xffff | 0x4b000000) + 1024.0) * fVar19 * 0.0009765625 * 4096.0;
      fVar34 = (((float)(uVar24 >> 0x10 | 0x53000000) - 5.497642e+11) +
                (float)(uVar24 & 0xffff | 0x4b000000) + 1024.0) * fVar19 * 0.0009765625 * 4096.0;
      uVar29 = (uint)fVar20;
      uVar30 = (uint)fVar21;
      uVar31 = (uint)fVar33;
      uVar32 = (uint)fVar34;
      puVar1 = (uint *)((long)DVar8.chipInf + lVar12 * 4);
      *puVar1 = (int)(fVar20 - 2.1474836e+09) & (int)uVar29 >> 0x1f | uVar29;
      puVar1[1] = (int)(fVar21 - 2.1474836e+09) & (int)uVar30 >> 0x1f | uVar30;
      puVar1[2] = (int)(fVar33 - 2.1474836e+09) & (int)uVar31 >> 0x1f | uVar31;
      puVar1[3] = (int)(fVar34 - 2.1474836e+09) & (int)uVar32 >> 0x1f | uVar32;
      auVar5 = _DAT_00181760;
      auVar4 = _DAT_0017f150;
      uVar9 = uVar9 + 4;
      uVar22 = uVar22 + 4;
      uVar23 = uVar23 + 4;
      uVar24 = uVar24 + 4;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x990);
    lVar12 = 0;
    do {
      dVar2 = BASE_TIMES[lVar12 + 4];
      dVar3 = BASE_TIMES[lVar12 + 5];
      auVar26._0_8_ = dVar2 * 44100.0;
      auVar26._8_8_ = dVar3 * 44100.0;
      auVar27 = divpd(auVar26,auVar4);
      auVar28._0_4_ = (float)auVar27._0_8_;
      auVar28._4_4_ = (float)auVar27._8_8_;
      auVar28._8_8_ = 0;
      auVar27 = divps(auVar5,auVar28);
      iVar7 = (int)auVar27._0_4_;
      iVar13 = (int)auVar27._4_4_;
      *(ulong *)((long)DVar8.chipInf + lVar12 * 4 + 0x1450) =
           CONCAT44((int)(auVar27._4_4_ - 2.1474836e+09),(int)(auVar27._0_4_ - 2.1474836e+09)) &
           CONCAT44(iVar13 >> 0x1f,iVar7 >> 0x1f) | CONCAT44(iVar13,iVar7);
      auVar27._0_8_ = dVar2 * 14.32833 * 44100.0;
      auVar27._8_8_ = dVar3 * 14.32833 * 44100.0;
      auVar27 = divpd(auVar27,auVar4);
      auVar25._0_4_ = (float)auVar27._0_8_;
      auVar25._4_4_ = (float)auVar27._8_8_;
      auVar25._8_8_ = 0;
      auVar27 = divps(auVar5,auVar25);
      iVar7 = (int)auVar27._0_4_;
      iVar13 = (int)auVar27._4_4_;
      *(ulong *)((long)DVar8.chipInf + lVar12 * 4 + 0x1550) =
           CONCAT44((int)(auVar27._4_4_ - 2.1474836e+09),(int)(auVar27._0_4_ - 2.1474836e+09)) &
           CONCAT44(iVar13 >> 0x1f,iVar7 >> 0x1f) | CONCAT44(iVar13,iVar7);
      lVar12 = lVar12 + 2;
    } while (lVar12 != 0x3c);
    ((DEV_DATA *)((long)DVar8.chipInf + 0x1440))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)DVar8.chipInf + 0x1448))->chipInf = (void *)0x0;
    *(undefined4 *)((long)DVar8.chipInf + 0x153c) = 0x4000000;
    ((DEV_DATA *)((long)DVar8.chipInf + 0x1540))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)DVar8.chipInf + 0x1548))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)DVar8.chipInf + 0x2640))->chipInf = (void *)0x4cffffff68;
    UVar6 = '\0';
    *(undefined1 *)((long)DVar8.chipInf + 0xb9) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0x171) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0x229) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0x2e1) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0x399) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0x451) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0x509) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0x5c1) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0x679) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0x731) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0x7e9) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0x8a1) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0x959) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0xa11) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0xac9) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0xb81) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0xc39) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0xcf1) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0xda9) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0xe61) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0xf19) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0xfd1) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0x1089) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0x1141) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0x11f9) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0x12b1) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0x1369) = 0;
    *(undefined1 *)((long)DVar8.chipInf + 0x1421) = 0;
    *(void **)DVar8.chipInf = DVar8.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar8.chipInf;
    retDevInf->sampleRate = (UINT32)(long)fVar19;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar6;
}

Assistant:

static UINT8 device_start_multipcm(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	MultiPCM *ptChip;
	INT32 i;

	ptChip = (MultiPCM *)calloc(1, sizeof(MultiPCM));
	if (ptChip == NULL)
		return 0xFF;
	
	ptChip->ROM = NULL;
	ptChip->ROMSize = 0x00;
	ptChip->ROMMask = 0x00;
	ptChip->rate = (float)cfg->clock / MULTIPCM_CLOCKDIV;

	if (! IsInit)
	{
	INT32 level;

	IsInit = 1;

	// Volume + pan table
	for (level = 0; level < 0x80; ++level)
	{
		const float vol_db = (float)level * (-24.0f) / 64.0f;
		const float total_level = powf(10.0f, vol_db / 20.0f) / 4.0f;
		INT32 pan;

		for (pan = 0; pan < 0x10; ++pan)
		{
			float pan_left, pan_right;
			if (pan == 0x8)
			{
				pan_left = 0.0;
				pan_right = 0.0;
			}
			else if (pan == 0x0)
			{
				pan_left = 1.0;
				pan_right = 1.0;
			}
			else if (pan & 0x8)
			{
				const INT32 inverted_pan = 0x10 - pan;
				const float pan_vol_db = (float)inverted_pan * (-12.0f) / 4.0f;

				pan_left = 1.0;
				pan_right = powf(10.0f, pan_vol_db / 20.0f);

				if ((inverted_pan & 0x7) == 7)
				{
					pan_right = 0.0;
				}
			}
			else
			{
				const float pan_vol_db = (float)pan * (-12.0f) / 4.0f;

				pan_left = powf(10.0f, pan_vol_db / 20.0f);
				pan_right = 1.0;

				if ((pan & 0x7) == 7)
				{
					pan_left = 0.0;
				}
			}

			left_pan_table[(pan << 7) | level] = value_to_fixed(TL_SHIFT, pan_left * total_level);
			right_pan_table[(pan << 7) | level] = value_to_fixed(TL_SHIFT, pan_right * total_level);
		}
	}

	// build the linear->exponential ramps
	for(i = 0; i < 0x400; ++i)
	{
		const float db = -(96.0f - (96.0f * (float)i / (float)0x400));
		const float exp_volume = powf(10.0f, db / 20.0f);
		linear_to_exp_volume[i] = value_to_fixed(TL_SHIFT, exp_volume);
	}

	lfo_init();
	}

	// Pitch steps
	for (i = 0; i < 0x400; ++i)
	{
		const float fcent = ptChip->rate * (1024.0f + (float)i) / 1024.0f;
		ptChip->freq_step_table[i] = value_to_fixed(TL_SHIFT, fcent);
	}

	// Envelope steps
	envelope_generator_init(ptChip, BASE_TIMES, 14.32833);

	// Total level interpolation steps
	ptChip->total_level_steps[0] = -(float)(0x80 << TL_SHIFT) / (78.2f * 44100.0f / 1000.0f); // lower
	ptChip->total_level_steps[1] = (float)(0x80 << TL_SHIFT) / (78.2f * 2 * 44100.0f / 1000.0f); // raise

	multipcm_set_mute_mask(ptChip, 0x00);

	ptChip->_devData.chipInf = ptChip;
	INIT_DEVINF(retDevInf, &ptChip->_devData, (UINT32)ptChip->rate, &devDef);

	return 0x00;
}